

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

bool __thiscall QProcessEnvironment::contains(QProcessEnvironment *this,QString *name)

{
  QProcessEnvironmentPrivate *this_00;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Key local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if (this_00 == (QProcessEnvironmentPrivate *)0x0) {
    bVar3 = false;
  }
  else {
    QProcessEnvironmentPrivate::prepareName(&local_28,this_00,name);
    pQVar1 = (this_00->vars).d.d.ptr;
    if (pQVar1 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      bVar3 = false;
    }
    else {
      cVar2 = std::
              _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QProcEnvValue>,_std::_Select1st<std::pair<const_QByteArray,_QProcEnvValue>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>
              ::find(&(pQVar1->m)._M_t,&local_28);
      bVar3 = (_Rb_tree_header *)cVar2._M_node !=
              &(((this_00->vars).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
    }
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessEnvironment::contains(const QString &name) const
{
    if (!d)
        return false;
    return d->vars.contains(d->prepareName(name));
}